

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall mjs::lexer::next_token(lexer *this)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  version vVar3;
  anon_unknown_2 *this_00;
  wchar_t *pwVar4;
  size_t sVar5;
  bool bVar6;
  unsigned_long uVar7;
  classification cVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int *piVar12;
  void *pvVar13;
  runtime_error *prVar14;
  ostream *poVar15;
  bool bVar16;
  char *__function;
  bool bVar17;
  anon_unknown_2 *paVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  char *__file;
  char *__assertion;
  bool bVar22;
  version in_R9D;
  anon_unknown_2 *pos;
  anon_unknown_2 *paVar23;
  bool bVar24;
  double dVar25;
  wstring_view s_00;
  wstring_view text;
  wstring_view text_00;
  wstring_view text_01;
  wstring_view text_02;
  wstring s;
  char *end;
  ostringstream oss;
  wstring local_210;
  wchar_t *local_1f0;
  token local_1e8;
  wchar_t *local_1c0;
  lexer *local_1b8;
  char *local_1b0;
  pair<mjs::token,_unsigned_long> local_1a8 [7];
  
  this_00 = (anon_unknown_2 *)(this->text_)._M_len;
  paVar23 = (anon_unknown_2 *)this->text_pos_;
  paVar18 = this_00 + -(long)paVar23;
  if (paVar18 == (anon_unknown_2 *)0x0) {
    token::operator=(&this->current_token_,(token *)eof_token);
    return;
  }
  if (this_00 < paVar23 || paVar18 == (anon_unknown_2 *)0x0) {
    __assert_fail("text_pos_ < text_.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x22a,"void mjs::lexer::next_token()");
  }
  pwVar4 = (this->text_)._M_str;
  pwVar1 = pwVar4 + (long)paVar23;
  wVar2 = *pwVar1;
  if ((wVar2 == L'\'') || (wVar2 == L'\"')) {
    vVar3 = this->version_;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    local_210._M_string_length = 0;
    local_210.field_2._M_local_buf[0] = L'\0';
    wVar2 = *pwVar1;
    local_1f0 = (wchar_t *)CONCAT44(local_1f0._4_4_,wVar2);
    local_1b8 = this;
    if ((wVar2 != L'\"') && (wVar2 != L'\'')) {
      __assert_fail("ch == \'\"\' || ch == \'\\\'\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                    ,0xd9,
                    "std::pair<token, size_t> mjs::(anonymous namespace)::get_string_literal(const std::wstring_view, const size_t, version)"
                   );
    }
    local_1c0 = pwVar4 + 2;
    bVar24 = false;
    do {
      paVar18 = paVar23 + 1;
      if (this_00 <= paVar18) {
        prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar14,"Unterminated string");
        __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      wVar2 = pwVar4[(long)(paVar23 + 1)];
      if (!bVar24) {
        bVar16 = true;
        if (wVar2 == L'\\') {
          bVar24 = true;
        }
        else if (wVar2 == (wchar_t)local_1f0) {
          paVar18 = paVar23 + 2;
          bVar16 = false;
        }
        else {
          if (((wVar2 == L'\n') || (wVar2 == L'\r')) ||
             ((vVar3 != es1 && ((wVar2 & 0xfffffffeU) == 0x2028)))) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar14,"Line terminator in string");
            goto LAB_00181990;
          }
          if ((vVar3 == es3) && (cVar8 = anon_unknown_2::classify(wVar2), cVar8 == format)) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar14,"Format control characters not allowed in string literals in ES3");
            goto LAB_00181990;
          }
          std::__cxx11::wstring::push_back((wchar_t)&local_210);
        }
        goto LAB_001812ef;
      }
      if (wVar2 < L'X') {
        if (0x37 < (uint)wVar2) {
LAB_00181253:
          if (wVar2 != L'U') goto switchD_0018116d_caseD_6f;
switchD_0018116d_caseD_75:
          if (this_00 <= paVar23 + 6) {
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar14,"Invalid unicode escape sequence");
            goto LAB_00181990;
          }
          get_hex_value4(local_1c0 + (long)paVar23);
          std::__cxx11::wstring::push_back((wchar_t)&local_210);
          paVar18 = paVar23 + 5;
LAB_00181283:
          bVar16 = true;
          bVar24 = false;
          goto LAB_001812ef;
        }
        uVar10 = (ulong)(uint)wVar2;
        if ((0xff000000000000U >> (uVar10 & 0x3f) & 1) == 0) {
          if ((0x2400UL >> (uVar10 & 0x3f) & 1) == 0) {
            if ((0x8400000000U >> (uVar10 & 0x3f) & 1) != 0) goto LAB_001812dc;
            goto LAB_00181253;
          }
          goto LAB_001812b2;
        }
        uVar21 = wVar2 + L'\xffffffd0';
        if (9 < uVar21) {
          uVar21 = 0xffffffff;
        }
        if (uVar21 < 8) {
          lVar11 = (ulong)(uVar21 < 4) + 2;
          lVar19 = 1;
          while (lVar20 = lVar19, paVar23 + lVar19 + 1 < this_00) {
            uVar21 = local_1c0[(long)(paVar23 + lVar19 + -1)] + L'\xffffffd0';
            if (9 < uVar21) {
              uVar21 = 0xffffffff;
            }
            if ((7 < uVar21) || (lVar19 = lVar19 + 1, lVar20 = lVar11, lVar11 == lVar19)) break;
          }
          std::__cxx11::wstring::push_back((wchar_t)&local_210);
          paVar18 = paVar23 + lVar20;
          goto LAB_00181283;
        }
        __assertion = "value < 8";
        __file = "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp";
        __function = 
        "std::pair<wchar_t, size_t> mjs::(anonymous namespace)::get_octal_escape_sequence(const std::wstring_view &, size_t)"
        ;
        goto LAB_001819bb;
      }
      if (wVar2 < L'f') {
        if (wVar2 == L'X') goto switchD_0018116d_caseD_78;
        if ((wVar2 == L'\\') || (wVar2 == L'b')) goto LAB_001812dc;
        goto switchD_0018116d_caseD_6f;
      }
      switch(wVar2) {
      case L'n':
        break;
      case L'o':
      case L'p':
      case L'q':
      case L's':
      case L'w':
        goto switchD_0018116d_caseD_6f;
      case L'r':
        break;
      case L't':
        break;
      case L'u':
        goto switchD_0018116d_caseD_75;
      case L'v':
        if (vVar3 == es1) goto LAB_00181a41;
        break;
      case L'x':
switchD_0018116d_caseD_78:
        if (this_00 <= paVar23 + 4) {
          prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar14,"Invalid hex escape sequence");
          goto LAB_00181990;
        }
        get_hex_value(pwVar4[(long)(paVar23 + 2)]);
        get_hex_value(pwVar4[(long)(paVar23 + 3)]);
        std::__cxx11::wstring::push_back((wchar_t)&local_210);
        paVar18 = paVar23 + 3;
        goto LAB_00181283;
      default:
        if (wVar2 == L'f') break;
        goto switchD_0018116d_caseD_6f;
      }
LAB_001812dc:
      std::__cxx11::wstring::push_back((wchar_t)&local_210);
LAB_001812e6:
      bVar16 = true;
      bVar24 = false;
LAB_001812ef:
      paVar23 = paVar18;
    } while (bVar16);
    token::token(&local_1e8,string_literal,&local_210);
    local_1a8[0].first.type_ = eof;
    token::operator=(&local_1a8[0].first,&local_1e8);
    local_1a8[0].second = (unsigned_long)paVar18;
    token::destroy(&local_1e8);
    this = local_1b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_local_buf[1],local_210.field_2._M_local_buf[0])
                      * 4 + 4);
    }
    token::operator=(&this->current_token_,&local_1a8[0].first);
    uVar7 = local_1a8[0].second;
    token::destroy(&local_1a8[0].first);
    local_1a8[0].second = uVar7;
    goto LAB_001813fa;
  }
  pos = paVar23 + 1;
  vVar3 = this->version_;
  if (((wVar2 == L'\n') || (wVar2 == L'\r')) || ((wVar2 & 0xfffffffeU) == 0x2028 && vVar3 != es1)) {
    paVar23 = pos;
    if (pos < this_00) {
      do {
        wVar2 = pwVar4[(long)pos];
        if (((wVar2 != L'\n') && (wVar2 != L'\r')) &&
           ((paVar23 = pos, vVar3 == es1 || ((wVar2 & 0xfffffffeU) != 0x2028)))) break;
        pos = pos + 1;
        paVar23 = this_00;
      } while (this_00 != pos);
    }
    local_1a8[0].first.type_ = line_terminator;
    token::operator=(&this->current_token_,&local_1a8[0].first);
    token::destroy(&local_1a8[0].first);
    local_1a8[0].second = (unsigned_long)paVar23;
    goto LAB_001813fa;
  }
  if ((9 < (uint)(wVar2 + L'\xffffffd0')) &&
     ((this_00 <= pos || wVar2 != L'.' || (9 < (uint)(pwVar4[(long)(paVar23 + 1)] + L'\xffffffd0')))
     )) {
    local_1f0 = pwVar1;
    pvVar13 = memchr("!%&()*+,-./:;<=>?[]^{|}~",wVar2,0x19);
    if (pvVar13 == (void *)0x0) {
      if ((((uint)wVar2 < 0x21) && ((0x100001a00U >> ((ulong)(uint)wVar2 & 0x3f) & 1) != 0)) ||
         (wVar2 == L'\xfeff' && 1 < (int)vVar3)) {
        text._M_str = (wchar_t *)paVar23;
        text._M_len = (size_t)pwVar4;
        anon_unknown_2::skip_whitespace(local_1a8,this_00,text,(ulong)vVar3,in_R9D);
        token::operator=(&this->current_token_,&local_1a8[0].first);
        token::destroy(&local_1a8[0].first);
      }
      else if (((wVar2 == L'$') || (wVar2 == L'_')) ||
              (((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a || (wVar2 == L'\\' && 0 < (int)vVar3)))
              ) {
        text_00._M_str = (wchar_t *)paVar23;
        text_00._M_len = (size_t)pwVar4;
        anon_unknown_2::get_identifier(local_1a8,this_00,text_00,(ulong)vVar3,in_R9D);
        token::operator=(&this->current_token_,&local_1a8[0].first);
        token::destroy(&local_1a8[0].first);
      }
      else {
        if ((int)vVar3 < 1) {
          cVar8 = other;
        }
        else {
          cVar8 = anon_unknown_2::classify(wVar2);
        }
        if (cVar8 == id_start) {
          text_02._M_str = (wchar_t *)this->text_pos_;
          text_02._M_len = (size_t)(this->text_)._M_str;
          anon_unknown_2::get_identifier
                    (local_1a8,(anon_unknown_2 *)(this->text_)._M_len,text_02,(ulong)this->version_,
                     in_R9D);
          token::operator=(&this->current_token_,&local_1a8[0].first);
          token::destroy(&local_1a8[0].first);
        }
        else {
          if (cVar8 != whitespace) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unhandled character in ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"next_token",10)
            ;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,wVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," 0x",3);
            *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) =
                 *(uint *)(poVar15 + *(long *)(*(long *)poVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,wVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
            prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar14,(string *)&local_1e8);
            __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          text_01._M_str = (wchar_t *)this->text_pos_;
          text_01._M_len = (size_t)(this->text_)._M_str;
          anon_unknown_2::skip_whitespace
                    (local_1a8,(anon_unknown_2 *)(this->text_)._M_len,text_01,(ulong)this->version_,
                     in_R9D);
          token::operator=(&this->current_token_,&local_1a8[0].first);
          token::destroy(&local_1a8[0].first);
        }
      }
    }
    else if ((pos < this_00 && wVar2 == L'/') &&
            ((pwVar4[(long)(paVar23 + 1)] == L'/' || (pwVar4[(long)(paVar23 + 1)] == L'*')))) {
      anon_unknown_2::skip_comment(local_1a8,&this->text_,(size_t)pos,vVar3);
      token::operator=(&this->current_token_,&local_1a8[0].first);
      token::destroy(&local_1a8[0].first);
    }
    else {
      s_00._M_str = (wchar_t *)paVar18;
      s_00._M_len = (size_t)&local_1e8;
      anon_unknown_2::get_punctuation(s_00,(version)local_1f0);
      sVar5 = this->text_pos_;
      local_1a8[0].first.type_ = local_1e8._4_4_;
      if ((local_1e8._4_4_ == string_literal) || (local_1e8._4_4_ == identifier)) {
        __assertion = "!has_text()";
        __file = "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h";
        __function = "mjs::token::token(token_type)";
LAB_001819bb:
        __assert_fail(__assertion,__file,0xa9,__function);
      }
      token::operator=(&this->current_token_,&local_1a8[0].first);
      token::destroy(&local_1a8[0].first);
      local_1a8[0].second = (unsigned_long)((long)(int)local_1e8.type_ + sVar5);
    }
    goto LAB_001813fa;
  }
  if (*pwVar1 == L'0') {
    dVar25 = 0.0;
    if (pos < this_00) {
      if (pwVar4[(long)(paVar23 + 1)] == L'.') goto LAB_00181443;
      iVar9 = tolower(pwVar4[(long)(paVar23 + 1)]);
      if (iVar9 == 0x78) {
        dVar25 = 0.0;
        do {
          paVar23 = this_00;
          if (pos + (2 - (long)this_00) == (anon_unknown_2 *)0x1) break;
          wVar2 = pwVar4[(long)(pos + 1)];
          if (((uint)(wVar2 + L'\xffffffd0') < 10) || (iVar9 = isalpha(wVar2), iVar9 != 0)) {
            uVar21 = get_hex_value(wVar2);
            dVar25 = dVar25 * 16.0 + (double)uVar21;
            bVar24 = true;
          }
          else {
            bVar24 = false;
          }
          pos = pos + 1;
          paVar23 = pos;
        } while (bVar24);
      }
      else {
        dVar25 = 0.0;
        if (this_00 <= pos) goto LAB_001817cd;
        do {
          wVar2 = pwVar4[(long)pos];
          if ((uint)(wVar2 + L'\xffffffd0') < 10) {
            if (L'7' < wVar2) {
              prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_1e8._0_8_ = (long)&local_1e8.field_1.text_ + 8;
              std::__cxx11::string::_M_construct((ulong)&local_1e8,'\x01');
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a8,"Invalid octal digit: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_1e8);
              std::runtime_error::runtime_error(prVar14,(string *)local_1a8);
              __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            dVar25 = dVar25 * 8.0 + (double)wVar2 + -48.0;
          }
          if (9 < (uint)(wVar2 + L'\xffffffd0')) goto LAB_001817cd;
          pos = pos + 1;
          paVar23 = this_00;
        } while (this_00 != pos);
      }
    }
    else {
LAB_001817cd:
      paVar23 = pos;
    }
    local_1e8.type_ = numeric_literal;
    local_1a8[0].first.type_ = eof;
    local_1e8.field_1.ivalue_ = (uint64_t)dVar25;
    token::operator=(&local_1a8[0].first,&local_1e8);
    local_1a8[0].second = (unsigned_long)paVar23;
    token::destroy(&local_1e8);
  }
  else {
LAB_00181443:
    paVar23 = pos;
    if (pos < this_00) {
      bVar24 = *pwVar1 == L'.';
      bVar17 = false;
      bVar22 = false;
      bVar16 = false;
      do {
        wVar2 = pwVar4[(long)pos];
        if ((uint)(wVar2 + L'\xffffffd0') < 10) {
          bVar6 = true;
          bVar22 = false;
        }
        else if ((wVar2 != L'.') || (bVar24)) {
          if (((wVar2 & 0xffffffdfU) != 0x45) || (bVar6 = true, bVar16)) {
            if (((bVar17) || (!bVar22)) || ((wVar2 != L'-' && (wVar2 != L'+')))) {
              bVar6 = false;
            }
            else {
              bVar6 = true;
              bVar22 = false;
              bVar17 = true;
            }
          }
          else {
            bVar16 = true;
            bVar22 = true;
          }
        }
        else {
          bVar6 = true;
          bVar22 = false;
          bVar24 = true;
        }
        paVar23 = pos;
      } while ((bVar6) && (pos = pos + 1, paVar23 = this_00, this_00 != pos));
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<wchar_t_const*>
              ((string *)&local_210,pwVar1,pwVar4 + (long)paVar23);
    piVar12 = __errno_location();
    *piVar12 = 0;
    local_1e8.field_1.dvalue_ = strtod((char *)local_210._M_dataplus._M_p,&local_1b0);
    if (local_1b0 != (char *)((long)local_210._M_dataplus._M_p + local_210._M_string_length)) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     "Invalid string literal ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210
                    );
      std::runtime_error::runtime_error(prVar14,(string *)local_1a8);
      __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*piVar12 == 0x22) {
      *piVar12 = 0;
    }
    local_1e8.type_ = numeric_literal;
    local_1a8[0].first.type_ = eof;
    token::operator=(&local_1a8[0].first,&local_1e8);
    local_1a8[0].second = (unsigned_long)paVar23;
    token::destroy(&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,
                      CONCAT44(local_210.field_2._M_local_buf[1],local_210.field_2._M_local_buf[0])
                      + 1);
    }
  }
  token::operator=(&this->current_token_,&local_1a8[0].first);
  uVar7 = local_1a8[0].second;
  token::destroy(&local_1a8[0].first);
  local_1a8[0].second = uVar7;
LAB_001813fa:
  this->text_pos_ = local_1a8[0].second;
  return;
switchD_0018116d_caseD_6f:
  if ((vVar3 == es1) || ((wVar2 & 0xfffffffeU) != 0x2028)) {
LAB_00181a41:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Unhandled escape sequence: \\",0x1c);
    local_1e8.type_._0_1_ = (char)wVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1e8,1);
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar14,(string *)&local_1e8);
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_001812b2:
  if ((int)vVar3 < 2) {
    prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar14,"Line continuations in string literals not supported until ES5");
LAB_00181990:
    __cxa_throw(prVar14,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  goto LAB_001812e6;
}

Assistant:

void lexer::next_token() {
    if (text_pos_ == text_.size()) {
        current_token_ = eof_token;
        return;
    }
    assert(text_pos_ < text_.size());

    const int ch = text_[text_pos_];
    size_t token_end = text_pos_ + 1;

    if (ch == '\''  || ch == '\"') {
        std::tie(current_token_, token_end) = get_string_literal(text_, text_pos_, version_);
    } else if (is_line_terminator(ch, version_)) {
        while (token_end < text_.size() && is_line_terminator(text_[token_end], version_)) {
            ++token_end;
        }
        current_token_  = token{token_type::line_terminator};
    } else if (is_digit(ch) || (ch == '.' && token_end < text_.size() && is_digit(text_[token_end]))) {
        std::tie(current_token_, token_end) = get_number_literal(text_, text_pos_, version_);
    } else if (std::strchr("!%&()*+,-./:;<=>?[]^{|}~", ch)) {
        if (ch == '/' && token_end < text_.size() && (text_[token_end] == '/' || text_[token_end] == '*')) {
            std::tie(current_token_, token_end)  = skip_comment(text_, token_end, version_);
        } else {
            auto [tok, len] = get_punctuation(std::wstring_view{&text_[text_pos_], text_.size() - text_pos_}, version_);
            token_end = text_pos_ + len;
            current_token_ = token{tok};
        }
    } else if (is_whitespace_v1(ch) || (version_ >= version::es5 && ch == unicode_BOM)) {
        std::tie(current_token_, token_end) = skip_whitespace(text_, text_pos_, version_);
    } else if (is_identifier_start_v1(ch) || (version_ >= version::es3 && ch == '\\')) {
        std::tie(current_token_, token_end) = get_identifier(text_, text_pos_, version_);
    } else {
        // Do more expensive classification
        switch (version_ >= version::es3 ? classify(ch) : unicode::classification::other) {
        case unicode::classification::whitespace:
            std::tie(current_token_, token_end) = skip_whitespace(text_, text_pos_, version_);
            break;
        case unicode::classification::id_start:
            std::tie(current_token_, token_end) = get_identifier(text_, text_pos_, version_);
            break;
        default:
            std::ostringstream oss;
            oss << "Unhandled character in " << __FUNCTION__ << ": " << ch << " 0x" << std::hex << (int)ch << "\n";
            throw std::runtime_error(oss.str());
        }
    }

    text_pos_ = token_end;
}